

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::IdleDecommitPageAllocator::EnterIdleDecommit(IdleDecommitPageAllocator *this)

{
  CriticalSection *this_00;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  ThreadContextId pvVar5;
  undefined4 *puVar6;
  AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag;
  
  uVar1 = (this->super_PageAllocator).idleDecommitEnterCount;
  (this->super_PageAllocator).idleDecommitEnterCount = uVar1 + 1;
  if (uVar1 == 0) {
    this_00 = &this->cs;
    bVar3 = CCLock::TryEnter(&this_00->super_CCLock);
    if (!bVar3) {
      (this->super_PageAllocator).waitingToEnterIdleDecommit = true;
      CCLock::Enter(&this_00->super_CCLock);
      (this->super_PageAllocator).waitingToEnterIdleDecommit = false;
    }
    (this->super_PageAllocator).isUsed = false;
    this->hadDecommitTimer = this->hasDecommitTimer;
    bVar3 = Js::Phases::IsEnabled
                      (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                       PageAllocatorPhase);
    if ((bVar3) && (((this->super_PageAllocator).pageAllocatorFlagTable)->Verbose == true)) {
      pvVar5 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar4 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar5,(ulong)DVar4,this);
      if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"EnterIdleDecommit");
      Output::Print(L"\n");
      Output::Flush();
    }
    uVar1 = (this->super_PageAllocator).maxFreePageCount;
    if (this->hasDecommitTimer == true) {
      if (uVar1 != this->maxIdleDecommitFreePageCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0x4a,"(this->maxFreePageCount == maxIdleDecommitFreePageCount)",
                           "this->maxFreePageCount == maxIdleDecommitFreePageCount");
        if (!bVar3) goto LAB_006e5350;
        *puVar6 = 0;
      }
      this->hasDecommitTimer = false;
      bVar3 = Js::Phases::IsEnabled
                        (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                         PageAllocatorPhase);
      if (bVar3) {
        pvVar5 = JsUtil::ExternalApi::GetCurrentThreadContextId();
        DVar4 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar5,(ulong)DVar4,this);
        if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ");
        }
        Output::Print(L"Cancel Decommit Timer");
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    else {
      if (uVar1 != this->maxNonIdleDecommitFreePageCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0x51,"(this->maxFreePageCount == maxNonIdleDecommitFreePageCount)",
                           "this->maxFreePageCount == maxNonIdleDecommitFreePageCount");
        if (!bVar3) goto LAB_006e5350;
        *puVar6 = 0;
      }
      if ((this->super_PageAllocator).minFreePageCount != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0x52,"(minFreePageCount == 0)","minFreePageCount == 0");
        if (!bVar3) goto LAB_006e5350;
        *puVar6 = 0;
      }
      (this->super_PageAllocator).maxFreePageCount = this->maxIdleDecommitFreePageCount;
    }
    CCLock::Leave(&this_00->super_CCLock);
    if (this->hasDecommitTimer == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                         ,0x58,"(!hasDecommitTimer)","!hasDecommitTimer");
      if (!bVar3) {
LAB_006e5350:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  return;
}

Assistant:

void
IdleDecommitPageAllocator::EnterIdleDecommit()
{
    this->idleDecommitEnterCount++;
    if (this->idleDecommitEnterCount != 1)
    {
        return;
    }
#ifdef IDLE_DECOMMIT_ENABLED
    if (!cs.TryEnter())
    {
        AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag(this);

#ifdef ENABLE_BASIC_TELEMETRY
        AllocatorDecommitStats * decommitStats = this->GetDecommitStats();
        decommitStats->lastEnterLeaveIdleDecommitTick = Js::Tick::Now();
#endif

        cs.Enter();

#ifdef ENABLE_BASIC_TELEMETRY
        decommitStats->lastEnterLeaveIdleDecommitCSWaitTime = Js::Tick::Now() - decommitStats->lastEnterLeaveIdleDecommitTick;
        decommitStats->totalEnterLeaveIdleDecommitCSWaitTime += decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
        if (decommitStats->lastEnterLeaveIdleDecommitCSWaitTime > decommitStats->maxEnterLeaveIdleDecommitCSWaitTime)
        {
            decommitStats->maxEnterLeaveIdleDecommitCSWaitTime = decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
        }
#endif
    }

    this->isUsed = false;
    this->hadDecommitTimer = hasDecommitTimer;
    PAGE_ALLOC_VERBOSE_TRACE(_u("EnterIdleDecommit"));
    if (hasDecommitTimer)
    {
        // Cancel the decommit timer
        Assert(this->maxFreePageCount == maxIdleDecommitFreePageCount);
        hasDecommitTimer = false;
        PAGE_ALLOC_TRACE(_u("Cancel Decommit Timer"));
    }
    else
    {
        // Switch to maxIdleDecommitFreePageCount
        Assert(this->maxFreePageCount == maxNonIdleDecommitFreePageCount);
        Assert(minFreePageCount == 0);
        this->maxFreePageCount = maxIdleDecommitFreePageCount;
    }

    cs.Leave();

    Assert(!hasDecommitTimer);
#else
    Assert(this->maxFreePageCount == maxNonIdleDecommitFreePageCount);
    this->maxFreePageCount = maxIdleDecommitFreePageCount;
#endif
}